

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

player_shape * player_shape_by_idx(wchar_t index)

{
  player_shape **pppVar1;
  
  pppVar1 = &shapes;
  do {
    pppVar1 = &((player_shape *)pppVar1)->next->next;
    if ((player_shape *)pppVar1 == (player_shape *)0x0) {
      msg("Could not find shape %d!");
      return (player_shape *)0x0;
    }
  } while (((player_shape *)pppVar1)->sidx != index);
  return (player_shape *)pppVar1;
}

Assistant:

struct player_shape *player_shape_by_idx(int index)
{
	struct player_shape *shape = shapes;
	while (shape) {
		if (shape->sidx == index) {
			return shape;
		}
		shape = shape->next;
	}
	msg("Could not find shape %d!", index);
	return NULL;
}